

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O2

int __thiscall GameBoard::init(GameBoard *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  QGridLayout *this_00;
  Field *this_01;
  int j;
  int i;
  QVector<Field_*> row;
  
  this->width_ = (int)ctx;
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,(QWidget *)0x0);
  this->layout_ = this_00;
  QWidget::setLayout((QLayout *)this);
  for (i = 0; iVar1 = this->width_, i < iVar1; i = i + 1) {
    row.d.d = (Data *)0x0;
    row.d.ptr = (Field **)0x0;
    row.d.size = 0;
    for (j = 0; j < iVar1; j = j + 1) {
      this_01 = (Field *)operator_new(0x30);
      Field::Field(this_01,i,j,(QWidget *)0x0);
      QList<Field_*>::append(&row,this_01);
      QGridLayout::addWidget(this->layout_,this_01,i,j,0);
      QObject::connect<void(Field::*)(int,int),void(GameBoard::*)(int,int)>
                ((Object *)&stack0xffffffffffffffc8,(offset_in_Field_to_subr)this_01,
                 (Object *)Field::fieldClicked,0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
      QObject::connect<void(GameBoard::*)(QString),void(QAbstractButton::*)(QString_const&)>
                ((Object *)&stack0xffffffffffffffc0,(offset_in_GameBoard_to_subr)this,
                 (Object *)setTextOnFields,0,(ConnectionType)SUB84(this_01,0));
      QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
      QWidget::setSizePolicy((QSizePolicy)SUB84(this_01,0));
      iVar1 = this->width_;
    }
    QList<QList<Field*>>::emplaceBack<QList<Field*>const&>
              ((QList<QList<Field*>> *)&this->grid_,(QList<Field_*> *)&row.d);
    QArrayDataPointer<Field_*>::~QArrayDataPointer(&row.d);
  }
  beginNewGame(this);
  return extraout_EAX;
}

Assistant:

void GameBoard::init(int width)
{
    width_ = width;
    layout_ = new QGridLayout;
    setLayout(layout_);

    for(int i = 0; i < width_; i++)
    {
        QVector<Field*> row;
        for(int j = 0; j < width_; j++)
        {
            Field* field = new Field(i,j);
            row.push_back(field);
            layout_->addWidget(field,i,j);

            connect(field, &Field::fieldClicked, this, &GameBoard::handleButtonClick);
            connect(this, &GameBoard::setTextOnFields, field, &Field::setText);
            field->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Preferred); //Make field resize when given more space

        }
        grid_.push_back(row);
    }

    beginNewGame();
}